

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

wchar_t format_small_keypad_key
                  (char *buf,Terminal *term,SmallKeypadKey key,_Bool shift,_Bool ctrl,_Bool alt,
                  _Bool *consumed_alt)

{
  wchar_t wVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 in_register_00000014;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  char *pcVar8;
  char cVar9;
  
  uVar5 = CONCAT44(in_register_00000014,key);
  switch(key) {
  case SKK_HOME:
    uVar5 = 1;
    break;
  case SKK_END:
    uVar5 = 4;
    break;
  case SKK_INSERT:
    break;
  case SKK_DELETE:
    bVar2 = true;
    goto LAB_0010fb65;
  case SKK_PGUP:
    uVar5 = 5;
    break;
  case SKK_PGDN:
    uVar5 = 6;
    break;
  default:
    __assert_fail("false && \"bad small keypad key enum value\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                  ,0x1d46,
                  "int format_small_keypad_key(char *, Terminal *, SmallKeypadKey, _Bool, _Bool, _Bool, _Bool *)"
                 );
  }
  bVar2 = false;
LAB_0010fb65:
  wVar1 = term->funky_type;
  iVar7 = (int)buf;
  if (wVar1 == L'\x03') {
    uVar6 = uVar5 & 0xffffffff;
    uVar5 = (ulong)(uint)(int)""[uVar6];
    cVar9 = term->vt52_mode;
    if (((_Bool)cVar9 == true) && ((int)""[uVar6] - 1U < 6)) {
LAB_0010fb9f:
      cVar9 = " HLMEIG"[uVar5 & 0xffffffff];
      pcVar8 = "\x1b%c";
      goto LAB_0010fbb3;
    }
LAB_0010fbd7:
    iVar3 = (int)uVar5;
    if (((iVar3 != 4) && (iVar3 != 1)) || (term->rxvt_homeend != true)) {
      if ((cVar9 == '\0') && (wVar1 == L'\x06')) {
        if (alt && consumed_alt != (_Bool *)0x0) {
          *consumed_alt = true;
        }
        uVar4 = (uint)shift + (uint)ctrl * 4 | (uint)alt * 2;
        if (uVar4 != 0) {
          iVar3 = sprintf(buf,"\x1b[%d;%d~",uVar5,(ulong)(uVar4 + 1));
          goto LAB_0010fc6a;
        }
      }
      pcVar8 = "\x1b[%d~";
      goto LAB_0010fc63;
    }
    pcVar8 = "\x1bOw";
    if (iVar3 == 1) {
      pcVar8 = "\x1b[H";
    }
    iVar3 = sprintf(buf,pcVar8);
  }
  else {
    if (term->vt52_mode != false) goto LAB_0010fb9f;
    if (wVar1 != L'\x05') {
      cVar9 = '\0';
      goto LAB_0010fbd7;
    }
    if (bVar2) {
      iVar3 = iVar7 + 1;
      *buf = '\x7f';
      goto LAB_0010fc6f;
    }
    cVar9 = "HL.FIG"[(int)uVar5 - 1];
    pcVar8 = "\x1b[%c";
LAB_0010fbb3:
    uVar5 = (ulong)(uint)(int)cVar9;
LAB_0010fc63:
    iVar3 = sprintf(buf,pcVar8,uVar5);
  }
LAB_0010fc6a:
  iVar3 = iVar3 + iVar7;
LAB_0010fc6f:
  return iVar3 - iVar7;
}

Assistant:

int format_small_keypad_key(char *buf, Terminal *term, SmallKeypadKey key,
                            bool shift, bool ctrl, bool alt,
                            bool *consumed_alt)
{
    char *p = buf;

    int code;
    switch (key) {
      case SKK_HOME: code = 1; break;
      case SKK_INSERT: code = 2; break;
      case SKK_DELETE: code = 3; break;
      case SKK_END: code = 4; break;
      case SKK_PGUP: code = 5; break;
      case SKK_PGDN: code = 6; break;
      default: unreachable("bad small keypad key enum value");
    }

    /* Reorder edit keys to physical order */
    if (term->funky_type == FUNKY_VT400 && code <= 6)
        code = "\0\2\1\4\5\3\6"[code];

    if (term->vt52_mode && code > 0 && code <= 6) {
        p += sprintf(p, "\x1B%c", " HLMEIG"[code]);
    } else if (term->funky_type == FUNKY_SCO) {
        static const char codes[] = "HL.FIG";
        if (code == 3) {
            *p++ = '\x7F';
        } else {
            p += sprintf(p, "\x1B[%c", codes[code-1]);
        }
    } else if ((code == 1 || code == 4) && term->rxvt_homeend) {
        p += sprintf(p, code == 1 ? "\x1B[H" : "\x1BOw");
    } else {
        if (term->vt52_mode) {
	    p += sprintf(p, "\x1B[%d~", code);
        } else {
            int bitmap = 0;
            if (term->funky_type == FUNKY_XTERM_216)
                bitmap = shift_bitmap(shift, ctrl, alt, consumed_alt);
            if (bitmap)
                p += sprintf(p, "\x1B[%d;%d~", code, bitmap);
            else
                p += sprintf(p, "\x1B[%d~", code);
        }
    }

    return p - buf;
}